

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

void __thiscall Instance::computeLengthConstraint(Instance *this,Train *train)

{
  uint uVar1;
  int iVar2;
  pointer pvVar3;
  pointer ppEVar4;
  bool bVar5;
  Z3_ast_vector p_Var6;
  ulong uVar7;
  Z3_ast p_Var8;
  pointer ppEVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  ulong uVar12;
  Instance *pIVar13;
  pointer ppEVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  pointer __x;
  expr_vector pathVars;
  expr_vector leftNetwork;
  expr_vector lengthHot;
  pathType path;
  ast local_c0;
  undefined1 local_b0 [16];
  Instance *local_a0;
  ast_vector_tpl<z3::expr> local_98;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> local_88;
  ulong local_70;
  Train *local_68;
  ast local_60;
  vector<z3::expr,_std::allocator<z3::expr>_> *local_50;
  pointer local_48;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> *local_40;
  ulong local_38;
  
  uVar1 = (train->start).arrivalTime;
  local_70 = (ulong)uVar1;
  if (uVar1 < this->maxTimeSteps) {
    local_50 = &this->constraints;
    local_a0 = this;
    local_68 = train;
    do {
      local_98.super_object.m_ctx = this->c;
      p_Var6 = (Z3_ast_vector)Z3_mk_ast_vector((local_98.super_object.m_ctx)->m_ctx);
      Z3_ast_vector_inc_ref((local_98.super_object.m_ctx)->m_ctx,p_Var6);
      pvVar3 = (local_a0->trainPaths).
               super__Vector_base<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>,_std::allocator<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __x = pvVar3[local_68->id].
            super__Vector_base<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      local_48 = *(pointer *)
                  ((long)&pvVar3[local_68->id].
                          super__Vector_base<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
                          ._M_impl.super__Vector_impl_data + 8);
      pIVar13 = local_a0;
      local_98.m_vector = p_Var6;
      if (__x != local_48) {
        do {
          std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::vector(&local_88,__x);
          if ((long)local_88.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)local_88.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl
                    .super__Vector_impl_data._M_start != 0) {
            uVar7 = (long)local_88.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_88.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3;
            uVar18 = 1;
            uVar15 = 0;
            local_40 = __x;
            do {
              uVar10 = local_68->length;
              uVar7 = uVar7 - 1;
              uVar16 = uVar15;
              uVar12 = uVar7;
              if (uVar7 < uVar18) {
                uVar12 = uVar18;
              }
              do {
                iVar2 = *(int *)(*(long *)((long)local_88.
                                                 super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_start +
                                          uVar16 * 8) + 0xc);
                uVar11 = uVar10 - iVar2;
                uVar17 = uVar16;
                if (uVar11 == 0 || (int)uVar10 < iVar2) break;
                uVar16 = uVar16 + 1;
                uVar17 = uVar12;
                uVar10 = uVar11;
              } while (uVar16 < uVar7);
              local_c0.super_object.m_ctx = pIVar13->c;
              p_Var8 = (Z3_ast)Z3_mk_ast_vector((local_c0.super_object.m_ctx)->m_ctx);
              Z3_ast_vector_inc_ref((local_c0.super_object.m_ctx)->m_ctx,p_Var8);
              ppEVar4 = (local_a0->graph).edges.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              pIVar13 = local_a0;
              local_c0.m_ast = p_Var8;
              local_38 = uVar18;
              for (ppEVar14 = (local_a0->graph).edges.
                              super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                              super__Vector_impl_data._M_start; ppEVar14 != ppEVar4;
                  ppEVar14 = ppEVar14 + 1) {
                for (uVar7 = uVar15; uVar7 <= uVar17; uVar7 = uVar7 + 1) {
                  if (*ppEVar14 ==
                      local_88.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar7]) {
                    z3::ast_vector_tpl<z3::expr>::operator[]
                              ((ast_vector_tpl<z3::expr> *)local_b0,
                               (int)(local_70 << 4) +
                               (int)(pIVar13->occupiedVars).
                                    super__Vector_base<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[local_68->id].
                                    super__Vector_base<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                    Z3_ast_vector_push((local_c0.super_object.m_ctx)->m_ctx,local_c0.m_ast,
                                       local_b0._8_8_);
                    z3::context::check_error(local_c0.super_object.m_ctx);
                    z3::ast::~ast((ast *)local_b0);
                    goto LAB_001061b3;
                  }
                }
                z3::ast_vector_tpl<z3::expr>::operator[]
                          ((ast_vector_tpl<z3::expr> *)&local_60,
                           (int)(local_70 << 4) +
                           (int)(pIVar13->occupiedVars).
                                super__Vector_base<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[local_68->id].
                                super__Vector_base<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
                bVar5 = z3::expr::is_bool((expr *)&local_60);
                if (!bVar5) goto LAB_001064fc;
                p_Var8 = (Z3_ast)Z3_mk_not((local_60.super_object.m_ctx)->m_ctx,local_60.m_ast);
                z3::context::check_error(local_60.super_object.m_ctx);
                local_b0._0_8_ = local_60.super_object.m_ctx;
                local_b0._8_8_ = p_Var8;
                Z3_inc_ref((local_60.super_object.m_ctx)->m_ctx,p_Var8);
                Z3_ast_vector_push((local_c0.super_object.m_ctx)->m_ctx,local_c0.m_ast,
                                   local_b0._8_8_);
                z3::context::check_error(local_c0.super_object.m_ctx);
                z3::ast::~ast((ast *)local_b0);
                z3::ast::~ast(&local_60);
                pIVar13 = local_a0;
LAB_001061b3:
              }
              z3::array<_Z3_ast_*>::array<z3::expr>
                        ((array<_Z3_ast_*> *)local_b0,(ast_vector_tpl<z3::expr> *)&local_c0);
              p_Var8 = (Z3_ast)Z3_mk_and((local_c0.super_object.m_ctx)->m_ctx,
                                         local_b0._8_8_ & 0xffffffff,local_b0._0_8_);
              z3::context::check_error(local_c0.super_object.m_ctx);
              local_60.super_object.m_ctx = local_c0.super_object.m_ctx;
              local_60.m_ast = p_Var8;
              Z3_inc_ref((local_c0.super_object.m_ctx)->m_ctx,p_Var8);
              if ((__uniq_ptr_impl<_Z3_ast_*,_std::default_delete<_Z3_ast_*[]>_>)local_b0._0_8_ !=
                  (__uniq_ptr_impl<_Z3_ast_*,_std::default_delete<_Z3_ast_*[]>_>)0x0) {
                operator_delete__((void *)local_b0._0_8_);
              }
              Z3_ast_vector_push((local_98.super_object.m_ctx)->m_ctx,local_98.m_vector,
                                 local_60.m_ast);
              pIVar13 = local_a0;
              z3::context::check_error(local_98.super_object.m_ctx);
              z3::ast::~ast(&local_60);
              z3::ast_vector_tpl<z3::expr>::~ast_vector_tpl((ast_vector_tpl<z3::expr> *)&local_c0);
              uVar15 = uVar15 + 1;
              uVar7 = (long)local_88.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_88.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3;
              uVar18 = local_38 + 1;
              __x = local_40;
            } while (uVar15 < uVar7);
          }
          if ((_Tuple_impl<0UL,__Z3_ast_**,_std::default_delete<_Z3_ast_*[]>_>)
              local_88.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
              super__Vector_impl_data._M_start != (_Z3_ast **)0x0) {
            operator_delete(local_88.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_88.
                                  super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_88.
                                  super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          __x = __x + 1;
        } while (__x != local_48);
      }
      local_b0._0_8_ = pIVar13->c;
      p_Var8 = (Z3_ast)Z3_mk_ast_vector(*(Z3_context *)(local_b0._0_8_ + 8));
      Z3_ast_vector_inc_ref(*(Z3_context *)(local_b0._0_8_ + 8),p_Var8);
      ppEVar4 = (local_a0->graph).edges.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_b0._8_8_ = p_Var8;
      for (ppEVar14 = (local_a0->graph).edges.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppEVar14 != ppEVar4;
          ppEVar14 = ppEVar14 + 1) {
        z3::ast_vector_tpl<z3::expr>::operator[]
                  ((ast_vector_tpl<z3::expr> *)&local_c0,
                   (int)(local_70 << 4) +
                   (int)(local_a0->occupiedVars).
                        super__Vector_base<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[local_68->id].
                        super__Vector_base<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        bVar5 = z3::expr::is_bool((expr *)&local_c0);
        if (!bVar5) {
LAB_001064fc:
          __assert_fail("a.is_bool()","/usr/include/z3++.h",0x609,"expr z3::operator!(const expr &)"
                       );
        }
        ppEVar9 = (pointer)Z3_mk_not((local_c0.super_object.m_ctx)->m_ctx,local_c0.m_ast);
        z3::context::check_error(local_c0.super_object.m_ctx);
        local_88.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_c0.super_object.m_ctx;
        local_88.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppEVar9;
        Z3_inc_ref((local_c0.super_object.m_ctx)->m_ctx,ppEVar9);
        Z3_ast_vector_push(*(Z3_context *)(local_b0._0_8_ + 8),local_b0._8_8_,
                           local_88.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish);
        z3::context::check_error((context *)local_b0._0_8_);
        z3::ast::~ast((ast *)&local_88);
        z3::ast::~ast(&local_c0);
      }
      z3::array<_Z3_ast_*>::array<z3::expr>
                ((array<_Z3_ast_*> *)&local_88,(ast_vector_tpl<z3::expr> *)local_b0);
      p_Var8 = (Z3_ast)Z3_mk_and(*(Z3_context *)(local_b0._0_8_ + 8),
                                 (ulong)local_88.
                                        super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff,
                                 local_88.
                                 super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
      z3::context::check_error((context *)local_b0._0_8_);
      local_c0.super_object.m_ctx = (context *)local_b0._0_8_;
      local_c0.m_ast = p_Var8;
      Z3_inc_ref(*(Z3_context *)(local_b0._0_8_ + 8),p_Var8);
      if (local_88.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete__(local_88.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
      }
      Z3_ast_vector_push((local_98.super_object.m_ctx)->m_ctx,local_98.m_vector,local_c0.m_ast);
      z3::context::check_error(local_98.super_object.m_ctx);
      z3::ast::~ast(&local_c0);
      z3::array<_Z3_ast_*>::array<z3::expr>((array<_Z3_ast_*> *)&local_88,&local_98);
      p_Var8 = (Z3_ast)Z3_mk_or((local_98.super_object.m_ctx)->m_ctx,
                                (ulong)local_88.
                                       super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff,
                                local_88.
                                super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      z3::context::check_error(local_98.super_object.m_ctx);
      local_c0.super_object.m_ctx = local_98.super_object.m_ctx;
      local_c0.m_ast = p_Var8;
      Z3_inc_ref((local_98.super_object.m_ctx)->m_ctx,p_Var8);
      if ((context *)
          local_88.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
          super__Vector_impl_data._M_start != (context *)0x0) {
        operator_delete__(local_88.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<z3::expr,_std::allocator<z3::expr>_>::emplace_back<z3::expr>
                (local_50,(expr *)&local_c0);
      this = local_a0;
      z3::ast::~ast(&local_c0);
      z3::ast_vector_tpl<z3::expr>::~ast_vector_tpl((ast_vector_tpl<z3::expr> *)local_b0);
      z3::ast_vector_tpl<z3::expr>::~ast_vector_tpl(&local_98);
      local_70 = local_70 + 1;
    } while (local_70 < this->maxTimeSteps);
  }
  return;
}

Assistant:

void Instance::computeLengthConstraint(const Train &train) {
  for (size_t time = train.start.arrivalTime; time < maxTimeSteps; time++) {
    expr_vector lengthHot(*c);
    for (pathType path : trainPaths[train.id]) {
      for (size_t startIndex = 0; startIndex < path.size(); startIndex++) {
        size_t lengthIndex = startIndex;
        int length = train.length;
        do {
          length -= path[lengthIndex]->length;
        } while (length > 0 && ++lengthIndex < path.size() - 1);

        expr_vector pathVars(*c);
        for (const Edge *edge : graph.edges) {
          bool inPath = false;
          for (size_t pathIndex = startIndex; pathIndex <= lengthIndex;
               pathIndex++) {
            if (edge == path[pathIndex]) {
              pathVars.push_back(occupiedVars[train.id][time][edge->id]);
              inPath = true;
              break;
            }
          }
          if (!inPath) {
            pathVars.push_back(!occupiedVars[train.id][time][edge->id]);
          }
        }
        lengthHot.push_back(mk_and(pathVars));
      }
    }
    expr_vector leftNetwork(*c);
    for (const Edge *edge : graph.edges)
      leftNetwork.push_back(!occupiedVars[train.id][time][edge->id]);

    lengthHot.push_back(mk_and(leftNetwork));
    constraints.push_back(mk_or(lengthHot));
  }
}